

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall
Js::FunctionBody::CreateCacheIdToPropertyIdMap
          (FunctionBody *this,uint rootObjectLoadInlineCacheStart,
          uint rootObjectLoadMethodInlineCacheStart,uint rootObjectStoreInlineCacheStart,
          uint totalFieldAccessInlineCacheCount,uint isInstInlineCacheCount)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  undefined4 *puVar4;
  
  uVar3 = GetCountField(this,RootObjectLoadInlineCacheStart);
  if (uVar3 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x107f,"(this->GetRootObjectLoadInlineCacheStart() == 0)",
                                "this->GetRootObjectLoadInlineCacheStart() == 0");
    if (!bVar2) goto LAB_00767d91;
    *puVar4 = 0;
  }
  uVar3 = GetCountField(this,RootObjectLoadMethodInlineCacheStart);
  if (uVar3 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1080,"(this->GetRootObjectLoadMethodInlineCacheStart() == 0)",
                                "this->GetRootObjectLoadMethodInlineCacheStart() == 0");
    if (!bVar2) goto LAB_00767d91;
    *puVar4 = 0;
  }
  uVar3 = GetCountField(this,RootObjectStoreInlineCacheStart);
  if (uVar3 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1081,"(this->GetRootObjectStoreInlineCacheStart() == 0)",
                                "this->GetRootObjectStoreInlineCacheStart() == 0");
    if (!bVar2) goto LAB_00767d91;
    *puVar4 = 0;
  }
  uVar3 = GetCountField(this,InlineCacheCount);
  if (uVar3 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1082,"(this->GetInlineCacheCount() == 0)",
                                "this->GetInlineCacheCount() == 0");
    if (!bVar2) goto LAB_00767d91;
    *puVar4 = 0;
  }
  uVar3 = GetCountField(this,IsInstInlineCacheCount);
  if (uVar3 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1083,"(this->GetIsInstInlineCacheCount() == 0)",
                                "this->GetIsInstInlineCacheCount() == 0");
    if (!bVar2) {
LAB_00767d91:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  SetCountField(this,RootObjectLoadInlineCacheStart,rootObjectLoadInlineCacheStart);
  SetCountField(this,RootObjectLoadMethodInlineCacheStart,rootObjectLoadMethodInlineCacheStart);
  SetCountField(this,RootObjectStoreInlineCacheStart,rootObjectStoreInlineCacheStart);
  SetCountField(this,InlineCacheCount,totalFieldAccessInlineCacheCount);
  SetCountField(this,IsInstInlineCacheCount,isInstInlineCacheCount);
  CreateCacheIdToPropertyIdMap(this);
  return;
}

Assistant:

void FunctionBody::CreateCacheIdToPropertyIdMap(uint rootObjectLoadInlineCacheStart, uint rootObjectLoadMethodInlineCacheStart,
        uint rootObjectStoreInlineCacheStart,
        uint totalFieldAccessInlineCacheCount, uint isInstInlineCacheCount)
    {
        Assert(this->GetRootObjectLoadInlineCacheStart() == 0);
        Assert(this->GetRootObjectLoadMethodInlineCacheStart() == 0);
        Assert(this->GetRootObjectStoreInlineCacheStart() == 0);
        Assert(this->GetInlineCacheCount() == 0);
        Assert(this->GetIsInstInlineCacheCount() == 0);

        this->SetRootObjectLoadInlineCacheStart(rootObjectLoadInlineCacheStart);
        this->SetRootObjectLoadMethodInlineCacheStart(rootObjectLoadMethodInlineCacheStart);
        this->SetRootObjectStoreInlineCacheStart(rootObjectStoreInlineCacheStart);
        this->SetInlineCacheCount(totalFieldAccessInlineCacheCount);
        this->SetIsInstInlineCacheCount(isInstInlineCacheCount);

        this->CreateCacheIdToPropertyIdMap();
    }